

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
diligent_spirv_cross::CompilerGLSL::to_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t id,
          bool register_expression_read)

{
  TypedID<(diligent_spirv_cross::Types)0> *pTVar1;
  uint uVar2;
  __node_base_ptr p_Var3;
  _Hash_node_base *p_Var4;
  Variant *pVVar5;
  size_t sVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  uint32_t uVar10;
  uint32_t type;
  int index;
  SPIRExpression *pSVar11;
  __node_base_ptr p_Var12;
  SPIRVariable *var;
  _func_int **pp_Var13;
  SPIRConstant *c;
  long *plVar14;
  size_type sVar15;
  SPIRType *pSVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  mapped_type *pmVar18;
  size_type sVar19;
  CompilerError *this_00;
  size_type *psVar20;
  char **ts_1;
  ulong uVar21;
  ulong uVar22;
  size_type sVar23;
  pointer pcVar24;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar25;
  __node_base_ptr p_Var26;
  TypedID<(diligent_spirv_cross::Types)0> *pTVar27;
  ID local_7c;
  string local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  _Alloc_hider local_38;
  
  uVar21 = (ulong)id;
  do {
    local_7c.id = (uint32_t)uVar21;
    uVar22 = (this->super_Compiler).invalid_expressions._M_h._M_bucket_count;
    uVar21 = uVar21 % uVar22;
    p_Var3 = (this->super_Compiler).invalid_expressions._M_h._M_buckets[uVar21];
    p_Var12 = (__node_base_ptr)0x0;
    if ((p_Var3 != (__node_base_ptr)0x0) &&
       (p_Var12 = p_Var3, p_Var26 = p_Var3->_M_nxt,
       *(uint32_t *)&p_Var3->_M_nxt[1]._M_nxt != local_7c.id)) {
      while (p_Var4 = p_Var26->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
        p_Var12 = (__node_base_ptr)0x0;
        if (((ulong)*(uint *)&p_Var4[1]._M_nxt % uVar22 != uVar21) ||
           (p_Var12 = p_Var26, p_Var26 = p_Var4, *(uint *)&p_Var4[1]._M_nxt == local_7c.id))
        goto LAB_0074c0e8;
      }
      p_Var12 = (__node_base_ptr)0x0;
    }
LAB_0074c0e8:
    if ((p_Var12 != (__node_base_ptr)0x0) && (p_Var12->_M_nxt != (_Hash_node_base *)0x0)) {
      handle_invalid_expression(this,local_7c.id);
    }
    pVVar5 = (this->super_Compiler).ir.ids.super_VectorView<diligent_spirv_cross::Variant>.ptr;
    if (pVVar5[local_7c.id].type == TypeExpression) {
      pSVar11 = Variant::get<diligent_spirv_cross::SPIRExpression>(pVVar5 + local_7c.id);
      sVar6 = (pSVar11->expression_dependencies).
              super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.
              buffer_size;
      if (sVar6 != 0) {
        pTVar27 = (pSVar11->expression_dependencies).
                  super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.
                  ptr;
        pTVar1 = pTVar27 + sVar6;
        do {
          uVar10 = pTVar27->id;
          uVar21 = (this->super_Compiler).invalid_expressions._M_h._M_bucket_count;
          uVar22 = (ulong)uVar10 % uVar21;
          p_Var3 = (this->super_Compiler).invalid_expressions._M_h._M_buckets[uVar22];
          p_Var12 = (__node_base_ptr)0x0;
          if ((p_Var3 != (__node_base_ptr)0x0) &&
             (p_Var12 = p_Var3, p_Var26 = p_Var3->_M_nxt,
             uVar10 != *(uint32_t *)&p_Var3->_M_nxt[1]._M_nxt)) {
            while (p_Var4 = p_Var26->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
              p_Var12 = (__node_base_ptr)0x0;
              if (((ulong)*(uint *)&p_Var4[1]._M_nxt % uVar21 != uVar22) ||
                 (p_Var12 = p_Var26, p_Var26 = p_Var4, uVar10 == *(uint *)&p_Var4[1]._M_nxt))
              goto LAB_0074c195;
            }
            p_Var12 = (__node_base_ptr)0x0;
          }
LAB_0074c195:
          if ((p_Var12 != (__node_base_ptr)0x0) && (p_Var12->_M_nxt != (_Hash_node_base *)0x0)) {
            handle_invalid_expression(this,uVar10);
          }
          pTVar27 = pTVar27 + 1;
        } while (pTVar27 != pTVar1);
      }
    }
    if ((register_expression_read & 1U) != 0) {
      track_expression_read(this,local_7c.id);
    }
    uVar21 = (ulong)local_7c.id;
    pVVar5 = (this->super_Compiler).ir.ids.super_VectorView<diligent_spirv_cross::Variant>.ptr +
             uVar21;
    if (pVVar5->type != TypeVariable) {
      switch(pVVar5->type) {
      case TypeConstant:
        c = Variant::get<diligent_spirv_cross::SPIRConstant>(pVVar5);
        pSVar16 = Variant::get<diligent_spirv_cross::SPIRType>
                            ((this->super_Compiler).ir.ids.
                             super_VectorView<diligent_spirv_cross::Variant>.ptr +
                             *(uint *)&(c->super_IVariant).field_0xc);
        bVar8 = Compiler::has_decoration
                          (&this->super_Compiler,(ID)(c->super_IVariant).self.id,BuiltIn);
        if (bVar8) {
          uVar10 = Compiler::get_decoration
                             (&this->super_Compiler,(ID)(c->super_IVariant).self.id,BuiltIn);
          (*(this->super_Compiler)._vptr_Compiler[0x14])
                    (__return_storage_ptr__,this,(ulong)uVar10,8);
          return __return_storage_ptr__;
        }
        if (c->specialization == true) {
          if (((this->backend).workgroup_size_is_hidden == true) &&
             (index = get_constant_mapping_to_workgroup_component(this,c), -1 < index)) {
            ts_1 = (char **)0x1;
            (*(this->super_Compiler)._vptr_Compiler[0x14])(&local_78,this,0x19);
            local_38._M_p = vector_swizzle(1,index);
            join<std::__cxx11::string,char_const*>
                      (__return_storage_ptr__,(diligent_spirv_cross *)&local_78,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_38,ts_1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(uint)local_78._M_dataplus._M_p) !=
                &local_78.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_78._M_dataplus._M_p._4_4_,
                                       (uint)local_78._M_dataplus._M_p));
            }
            if (pSVar16->basetype == UInt) {
              return __return_storage_ptr__;
            }
            bitcast_expression(&local_78,this,pSVar16,UInt,__return_storage_ptr__);
            ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_78);
            paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(uint)local_78._M_dataplus._M_p);
            if (paVar25 == &local_78.field_2) {
              return __return_storage_ptr__;
            }
            goto LAB_0074c5d0;
          }
          local_78._M_dataplus._M_p._0_4_ = local_7c.id;
          sVar19 = ::std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::count(&(this->super_Compiler).forwarded_temporaries._M_h,
                           (key_type_conflict *)&local_78);
          if (sVar19 != 0) goto LAB_0074c687;
        }
        else if (((c->is_used_as_lut != true) &&
                 ((pSVar16->basetype != Struct ||
                  ((this->backend).can_declare_struct_inline != false)))) &&
                (((pSVar16->array).super_VectorView<unsigned_int>.buffer_size == 0 ||
                 ((this->backend).can_declare_arrays_inline != false)))) {
LAB_0074c687:
          constant_expression_abi_cxx11_(__return_storage_ptr__,this,c,false,false);
          return __return_storage_ptr__;
        }
LAB_0074c69f:
        uVar21 = (ulong)local_7c.id;
        pp_Var13 = (this->super_Compiler)._vptr_Compiler;
LAB_0074c28e:
        (*pp_Var13[6])(__return_storage_ptr__,this,uVar21,1);
        return __return_storage_ptr__;
      default:
        pp_Var13 = (this->super_Compiler)._vptr_Compiler;
        goto LAB_0074c28e;
      case TypeExpression:
        pSVar11 = Variant::get<diligent_spirv_cross::SPIRExpression>(pVVar5);
        uVar10 = *(uint32_t *)&(pSVar11->super_IVariant).field_0xc;
        if (uVar10 == 0) {
          if (pSVar11->need_transpose != true) {
            sVar15 = ::std::
                     _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::count(&(this->flattened_structs)._M_h,&local_7c.id);
            if (sVar15 != 0) {
              pSVar16 = Variant::get<diligent_spirv_cross::SPIRType>
                                  ((this->super_Compiler).ir.ids.
                                   super_VectorView<diligent_spirv_cross::Variant>.ptr +
                                   (pSVar11->expression_type).id);
              load_flattened_struct(__return_storage_ptr__,this,&pSVar11->expression,pSVar16);
              return __return_storage_ptr__;
            }
            bVar8 = Compiler::is_forcing_recompilation(&this->super_Compiler);
            if (bVar8) {
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2
              ;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)__return_storage_ptr__,"_","");
              return __return_storage_ptr__;
            }
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            pcVar24 = (pSVar11->expression)._M_dataplus._M_p;
            sVar23 = (pSVar11->expression)._M_string_length;
            goto LAB_0074c25d;
          }
          uVar10 = Compiler::get_extended_decoration
                             (&this->super_Compiler,local_7c.id,SPIRVCrossDecorationPhysicalTypeID);
          bVar8 = Compiler::has_extended_decoration
                            (&this->super_Compiler,local_7c.id,
                             SPIRVCrossDecorationPhysicalTypePacked);
          bVar9 = Compiler::has_decoration
                            (&this->super_Compiler,local_7c,DecorationRelaxedPrecision);
          local_58[0] = &local_48;
          pcVar24 = (pSVar11->expression)._M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_58,pcVar24,pcVar24 + (pSVar11->expression)._M_string_length);
          pSVar16 = Variant::get<diligent_spirv_cross::SPIRType>
                              ((this->super_Compiler).ir.ids.
                               super_VectorView<diligent_spirv_cross::Variant>.ptr +
                               (pSVar11->expression_type).id);
          (*(this->super_Compiler)._vptr_Compiler[0x2b])
                    (__return_storage_ptr__,this,local_58,pSVar16,(ulong)uVar10,(ulong)bVar8,
                     (uint)bVar9);
          paVar17 = &local_48;
          paVar25 = local_58[0];
        }
        else {
          to_enclosed_expression_abi_cxx11_(&local_78,this,uVar10,true);
          plVar14 = (long *)::std::__cxx11::string::_M_append
                                      ((char *)&local_78,
                                       (ulong)(pSVar11->expression)._M_dataplus._M_p);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          psVar20 = (size_type *)(plVar14 + 2);
          if ((size_type *)*plVar14 == psVar20) {
            lVar7 = plVar14[3];
            (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar20;
            *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar7;
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar14;
            (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar20;
          }
          __return_storage_ptr__->_M_string_length = plVar14[1];
          *plVar14 = (long)psVar20;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
LAB_0074c5c2:
          paVar17 = &local_78.field_2;
          paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(uint)local_78._M_dataplus._M_p);
        }
        if (paVar25 == paVar17) {
          return __return_storage_ptr__;
        }
LAB_0074c5d0:
        operator_delete(paVar25);
        return __return_storage_ptr__;
      case TypeCombinedImageSampler:
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (this_00,"Combined image samplers have no default expression representation.");
        break;
      case TypeAccessChain:
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (this_00,"Access chains have no default expression representation.");
      }
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    var = Variant::get<diligent_spirv_cross::SPIRVariable>(pVVar5);
    if ((var->statically_assigned == false) &&
       ((var->loop_variable != true || (var->loop_variable_enable != false)))) {
      if (var->deferred_declaration == true) {
        var->deferred_declaration = false;
        (*(this->super_Compiler)._vptr_Compiler[0x28])(__return_storage_ptr__,this,var);
        return __return_storage_ptr__;
      }
      sVar15 = ::std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::count(&(this->flattened_structs)._M_h,&local_7c.id);
      if (sVar15 != 0) {
        (*(this->super_Compiler)._vptr_Compiler[6])(&local_78,this,(ulong)local_7c.id,1);
        pSVar16 = Variant::get<diligent_spirv_cross::SPIRType>
                            ((this->super_Compiler).ir.ids.
                             super_VectorView<diligent_spirv_cross::Variant>.ptr +
                             *(uint *)&(var->super_IVariant).field_0xc);
        load_flattened_struct(__return_storage_ptr__,this,&local_78,pSVar16);
        goto LAB_0074c5c2;
      }
      pmVar18 = ::std::__detail::
                _Map_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&(this->super_Compiler).ir.meta,&(var->super_IVariant).self);
      if ((pmVar18->decoration).builtin == true) {
        (*(this->super_Compiler)._vptr_Compiler[0x14])
                  (__return_storage_ptr__,this,(ulong)(pmVar18->decoration).builtin_type,
                   (ulong)var->storage);
        return __return_storage_ptr__;
      }
      goto LAB_0074c69f;
    }
    uVar2 = (var->static_expression).id;
    uVar21 = (ulong)uVar2;
    register_expression_read = true;
  } while ((uVar2 != 0) || (uVar2 = (var->initializer).id, uVar21 = (ulong)uVar2, uVar2 != 0));
  uVar10 = ParsedIR::increase_bound_by(&(this->super_Compiler).ir,1);
  type = Compiler::get_variable_data_type_id(&this->super_Compiler,var);
  pSVar11 = emit_uninitialized_temporary_expression(this,type,uVar10);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar24 = (pSVar11->expression)._M_dataplus._M_p;
  sVar23 = (pSVar11->expression)._M_string_length;
LAB_0074c25d:
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar24,pcVar24 + sVar23);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_expression(uint32_t id, bool register_expression_read)
{
	auto itr = invalid_expressions.find(id);
	if (itr != end(invalid_expressions))
		handle_invalid_expression(id);

	if (ir.ids[id].get_type() == TypeExpression)
	{
		// We might have a more complex chain of dependencies.
		// A possible scenario is that we
		//
		// %1 = OpLoad
		// %2 = OpDoSomething %1 %1. here %2 will have a dependency on %1.
		// %3 = OpDoSomethingAgain %2 %2. Here %3 will lose the link to %1 since we don't propagate the dependencies like that.
		// OpStore %1 %foo // Here we can invalidate %1, and hence all expressions which depend on %1. Only %2 will know since it's part of invalid_expressions.
		// %4 = OpDoSomethingAnotherTime %3 %3 // If we forward all expressions we will see %1 expression after store, not before.
		//
		// However, we can propagate up a list of depended expressions when we used %2, so we can check if %2 is invalid when reading %3 after the store,
		// and see that we should not forward reads of the original variable.
		auto &expr = get<SPIRExpression>(id);
		for (uint32_t dep : expr.expression_dependencies)
			if (invalid_expressions.find(dep) != end(invalid_expressions))
				handle_invalid_expression(dep);
	}

	if (register_expression_read)
		track_expression_read(id);

	switch (ir.ids[id].get_type())
	{
	case TypeExpression:
	{
		auto &e = get<SPIRExpression>(id);
		if (e.base_expression)
			return to_enclosed_expression(e.base_expression) + e.expression;
		else if (e.need_transpose)
		{
			// This should not be reached for access chains, since we always deal explicitly with transpose state
			// when consuming an access chain expression.
			uint32_t physical_type_id = get_extended_decoration(id, SPIRVCrossDecorationPhysicalTypeID);
			bool is_packed = has_extended_decoration(id, SPIRVCrossDecorationPhysicalTypePacked);
			bool relaxed = has_decoration(id, DecorationRelaxedPrecision);
			return convert_row_major_matrix(e.expression, get<SPIRType>(e.expression_type), physical_type_id,
			                                is_packed, relaxed);
		}
		else if (flattened_structs.count(id))
		{
			return load_flattened_struct(e.expression, get<SPIRType>(e.expression_type));
		}
		else
		{
			if (is_forcing_recompilation())
			{
				// During first compilation phase, certain expression patterns can trigger exponential growth of memory.
				// Avoid this by returning dummy expressions during this phase.
				// Do not use empty expressions here, because those are sentinels for other cases.
				return "_";
			}
			else
				return e.expression;
		}
	}

	case TypeConstant:
	{
		auto &c = get<SPIRConstant>(id);
		auto &type = get<SPIRType>(c.constant_type);

		// WorkGroupSize may be a constant.
		if (has_decoration(c.self, DecorationBuiltIn))
			return builtin_to_glsl(BuiltIn(get_decoration(c.self, DecorationBuiltIn)), StorageClassGeneric);
		else if (c.specialization)
		{
			if (backend.workgroup_size_is_hidden)
			{
				int wg_index = get_constant_mapping_to_workgroup_component(c);
				if (wg_index >= 0)
				{
					auto wg_size = join(builtin_to_glsl(BuiltInWorkgroupSize, StorageClassInput), vector_swizzle(1, wg_index));
					if (type.basetype != SPIRType::UInt)
						wg_size = bitcast_expression(type, SPIRType::UInt, wg_size);
					return wg_size;
				}
			}

			if (expression_is_forwarded(id))
				return constant_expression(c);

			return to_name(id);
		}
		else if (c.is_used_as_lut)
			return to_name(id);
		else if (type.basetype == SPIRType::Struct && !backend.can_declare_struct_inline)
			return to_name(id);
		else if (!type.array.empty() && !backend.can_declare_arrays_inline)
			return to_name(id);
		else
			return constant_expression(c);
	}

	case TypeConstantOp:
		return to_name(id);

	case TypeVariable:
	{
		auto &var = get<SPIRVariable>(id);
		// If we try to use a loop variable before the loop header, we have to redirect it to the static expression,
		// the variable has not been declared yet.
		if (var.statically_assigned || (var.loop_variable && !var.loop_variable_enable))
		{
			// We might try to load from a loop variable before it has been initialized.
			// Prefer static expression and fallback to initializer.
			if (var.static_expression)
				return to_expression(var.static_expression);
			else if (var.initializer)
				return to_expression(var.initializer);
			else
			{
				// We cannot declare the variable yet, so have to fake it.
				uint32_t undef_id = ir.increase_bound_by(1);
				return emit_uninitialized_temporary_expression(get_variable_data_type_id(var), undef_id).expression;
			}
		}
		else if (var.deferred_declaration)
		{
			var.deferred_declaration = false;
			return variable_decl(var);
		}
		else if (flattened_structs.count(id))
		{
			return load_flattened_struct(to_name(id), get<SPIRType>(var.basetype));
		}
		else
		{
			auto &dec = ir.meta[var.self].decoration;
			if (dec.builtin)
				return builtin_to_glsl(dec.builtin_type, var.storage);
			else
				return to_name(id);
		}
	}

	case TypeCombinedImageSampler:
		// This type should never be taken the expression of directly.
		// The intention is that texture sampling functions will extract the image and samplers
		// separately and take their expressions as needed.
		// GLSL does not use this type because OpSampledImage immediately creates a combined image sampler
		// expression ala sampler2D(texture, sampler).
		SPIRV_CROSS_THROW("Combined image samplers have no default expression representation.");

	case TypeAccessChain:
		// We cannot express this type. They only have meaning in other OpAccessChains, OpStore or OpLoad.
		SPIRV_CROSS_THROW("Access chains have no default expression representation.");

	default:
		return to_name(id);
	}
}